

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_buffer.cpp
# Opt level: O2

void __thiscall
duckdb::UndoBuffer::RevertCommit
          (UndoBuffer *this,IteratorState *end_state,transaction_t transaction_id)

{
  optional_ptr<duckdb::UndoBufferEntry,_true> *this_00;
  UndoFlags type;
  UndoFlags UVar1;
  BufferManager *pBVar2;
  UndoBufferEntry *pUVar3;
  UndoFlags *pUVar4;
  IteratorState start_state;
  CommitState state;
  IteratorState local_90;
  UndoBuffer *local_60;
  CommitState local_58;
  BufferHandle local_48;
  
  CommitState::CommitState(&local_58,this->transaction,transaction_id);
  IteratorState::IteratorState(&local_90);
  this_00 = &local_90.current;
  local_90.current.ptr = (this->allocator).tail.ptr;
  local_60 = this;
  while (local_90.current.ptr != (UndoBufferEntry *)0x0) {
    pBVar2 = (local_60->allocator).buffer_manager;
    pUVar3 = optional_ptr<duckdb::UndoBufferEntry,_true>::operator->(this_00);
    (*pBVar2->_vptr_BufferManager[7])(&local_48,pBVar2,&pUVar3->block);
    BufferHandle::operator=(&local_90.handle,&local_48);
    BufferHandle::~BufferHandle(&local_48);
    pUVar4 = (UndoFlags *)BufferHandle::Ptr(&local_90.handle);
    local_90.start = (data_ptr_t)pUVar4;
    if (local_90.current.ptr == (end_state->current).ptr) {
      local_90.end = end_state->start;
    }
    else {
      pUVar3 = optional_ptr<duckdb::UndoBufferEntry,_true>::operator->(this_00);
      local_90.end = (data_ptr_t)((long)pUVar4 + pUVar3->position);
    }
    for (; local_90.start < local_90.end;
        local_90.start = (data_ptr_t)((ulong)UVar1 + (long)local_90.start)) {
      type = *(UndoFlags *)local_90.start;
      UVar1 = *(UndoFlags *)((long)local_90.start + 4);
      local_90.start = (data_ptr_t)((long)local_90.start + 8);
      CommitState::RevertCommit(&local_58,type,local_90.start);
    }
    if (local_90.current.ptr == (end_state->current).ptr) break;
    pUVar3 = optional_ptr<duckdb::UndoBufferEntry,_true>::operator->(this_00);
    local_90.current.ptr = (pUVar3->prev).ptr;
  }
  BufferHandle::~BufferHandle(&local_90.handle);
  return;
}

Assistant:

void UndoBuffer::RevertCommit(UndoBuffer::IteratorState &end_state, transaction_t transaction_id) {
	CommitState state(transaction, transaction_id);
	UndoBuffer::IteratorState start_state;
	IterateEntries(start_state, end_state, [&](UndoFlags type, data_ptr_t data) { state.RevertCommit(type, data); });
}